

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdnslookup_p.h
# Opt level: O1

void __thiscall QDnsLookupReply::makeInvalidReplyError(QDnsLookupReply *this,QString *msg)

{
  int iVar1;
  QArrayData *pQVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  Data *pDVar6;
  QDnsDomainNameRecord *pQVar7;
  qsizetype qVar8;
  Data *pDVar9;
  QDnsHostAddressRecord *pQVar10;
  Data *pDVar11;
  QDnsMailExchangeRecord *pQVar12;
  Data *pDVar13;
  QDnsServiceRecord *pQVar14;
  Data *pDVar15;
  QDnsTlsAssociationRecord *pQVar16;
  Data *pDVar17;
  QDnsTextRecord *pQVar18;
  long in_FS_OFFSET;
  QAnyStringView QVar19;
  QArrayDataPointer<QDnsServiceRecord> local_148;
  QDnsLookupReply local_128;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((msg->d).size == 0) {
    QMetaObject::tr((char *)&local_128,(char *)&QDnsLookup::staticMetaObject,0x280c83);
    local_148.d = (Data *)(msg->d).d;
    pDVar3 = (Data *)(msg->d).ptr;
    (msg->d).d = (Data *)local_128._0_8_;
    (msg->d).ptr = (char16_t *)local_128.errorString.d.d;
    pcVar4 = (char16_t *)(msg->d).size;
    (msg->d).size = (qsizetype)local_128.errorString.d.ptr;
    local_128._0_8_ = local_148.d;
    local_128.errorString.d.d = pDVar3;
    local_128.errorString.d.ptr = pcVar4;
    if ((QArrayData *)local_148.d == (QArrayData *)0x0) goto LAB_00237824;
    LOCK();
    (((QArrayData *)local_148.d)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)local_148.d)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    iVar1 = (((QArrayData *)local_148.d)->ref_)._q_value.super___atomic_base<int>._M_i;
    UNLOCK();
  }
  else {
    QMetaObject::tr((char *)&local_148,(char *)&QDnsLookup::staticMetaObject,0x280c9a);
    QVar19.m_size = (size_t)&local_148;
    QVar19.field_0.m_data = &local_128;
    QString::arg_impl(QVar19,(int)(msg->d).ptr,(QChar)(char16_t)(msg->d).size);
    pQVar2 = &((msg->d).d)->super_QArrayData;
    pDVar3 = (Data *)(msg->d).ptr;
    (msg->d).d = (Data *)local_128._0_8_;
    (msg->d).ptr = (char16_t *)local_128.errorString.d.d;
    pcVar4 = (char16_t *)(msg->d).size;
    (msg->d).size = (qsizetype)local_128.errorString.d.ptr;
    local_128._0_8_ = pQVar2;
    local_128.errorString.d.d = pDVar3;
    local_128.errorString.d.ptr = pcVar4;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
    if (&(local_148.d)->super_QArrayData == (QArrayData *)0x0) goto LAB_00237824;
    LOCK();
    ((local_148.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_148.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    iVar1 = ((local_148.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    UNLOCK();
  }
  if (iVar1 == 0) {
    QArrayData::deallocate(&(local_148.d)->super_QArrayData,2,0x10);
  }
LAB_00237824:
  memset(&local_128,0,0xf0);
  qVar8 = local_128.canonicalNameRecords.d.size;
  pQVar7 = local_128.canonicalNameRecords.d.ptr;
  pDVar6 = local_128.canonicalNameRecords.d.d;
  this->error = NoError;
  this->authenticData = false;
  local_128.errorString.d.d = (this->errorString).d.d;
  pcVar4 = (this->errorString).d.ptr;
  (this->errorString).d.d = (Data *)0x0;
  (this->errorString).d.ptr = local_128.errorString.d.ptr;
  qVar5 = (this->errorString).d.size;
  (this->errorString).d.size = local_128.errorString.d.size;
  local_128.canonicalNameRecords.d.d = (Data *)0x0;
  local_128.canonicalNameRecords.d.ptr = (QDnsDomainNameRecord *)0x0;
  local_128.canonicalNameRecords.d.size = 0;
  local_148.d = (Data *)(this->canonicalNameRecords).d.d;
  local_148.ptr = (QDnsServiceRecord *)(this->canonicalNameRecords).d.ptr;
  (this->canonicalNameRecords).d.d = pDVar6;
  (this->canonicalNameRecords).d.ptr = pQVar7;
  local_148.size = (this->canonicalNameRecords).d.size;
  (this->canonicalNameRecords).d.size = qVar8;
  local_128.errorString.d.ptr = pcVar4;
  local_128.errorString.d.size = qVar5;
  QArrayDataPointer<QDnsDomainNameRecord>::~QArrayDataPointer
            ((QArrayDataPointer<QDnsDomainNameRecord> *)&local_148);
  qVar5 = local_128.hostAddressRecords.d.size;
  pQVar10 = local_128.hostAddressRecords.d.ptr;
  pDVar9 = local_128.hostAddressRecords.d.d;
  local_128.hostAddressRecords.d.d = (Data *)0x0;
  local_128.hostAddressRecords.d.ptr = (QDnsHostAddressRecord *)0x0;
  local_128.hostAddressRecords.d.size = 0;
  local_148.d = (Data *)(this->hostAddressRecords).d.d;
  local_148.ptr = (QDnsServiceRecord *)(this->hostAddressRecords).d.ptr;
  (this->hostAddressRecords).d.d = pDVar9;
  (this->hostAddressRecords).d.ptr = pQVar10;
  local_148.size = (this->hostAddressRecords).d.size;
  (this->hostAddressRecords).d.size = qVar5;
  QArrayDataPointer<QDnsHostAddressRecord>::~QArrayDataPointer
            ((QArrayDataPointer<QDnsHostAddressRecord> *)&local_148);
  qVar5 = local_128.mailExchangeRecords.d.size;
  pQVar12 = local_128.mailExchangeRecords.d.ptr;
  pDVar11 = local_128.mailExchangeRecords.d.d;
  local_128.mailExchangeRecords.d.d = (Data *)0x0;
  local_128.mailExchangeRecords.d.ptr = (QDnsMailExchangeRecord *)0x0;
  local_128.mailExchangeRecords.d.size = 0;
  local_148.d = (Data *)(this->mailExchangeRecords).d.d;
  local_148.ptr = (QDnsServiceRecord *)(this->mailExchangeRecords).d.ptr;
  (this->mailExchangeRecords).d.d = pDVar11;
  (this->mailExchangeRecords).d.ptr = pQVar12;
  local_148.size = (this->mailExchangeRecords).d.size;
  (this->mailExchangeRecords).d.size = qVar5;
  QArrayDataPointer<QDnsMailExchangeRecord>::~QArrayDataPointer
            ((QArrayDataPointer<QDnsMailExchangeRecord> *)&local_148);
  qVar5 = local_128.nameServerRecords.d.size;
  pQVar7 = local_128.nameServerRecords.d.ptr;
  pDVar6 = local_128.nameServerRecords.d.d;
  local_128.nameServerRecords.d.d = (Data *)0x0;
  local_128.nameServerRecords.d.ptr = (QDnsDomainNameRecord *)0x0;
  local_128.nameServerRecords.d.size = 0;
  local_148.d = (Data *)(this->nameServerRecords).d.d;
  local_148.ptr = (QDnsServiceRecord *)(this->nameServerRecords).d.ptr;
  (this->nameServerRecords).d.d = pDVar6;
  (this->nameServerRecords).d.ptr = pQVar7;
  local_148.size = (this->nameServerRecords).d.size;
  (this->nameServerRecords).d.size = qVar5;
  QArrayDataPointer<QDnsDomainNameRecord>::~QArrayDataPointer
            ((QArrayDataPointer<QDnsDomainNameRecord> *)&local_148);
  qVar5 = local_128.pointerRecords.d.size;
  pQVar7 = local_128.pointerRecords.d.ptr;
  pDVar6 = local_128.pointerRecords.d.d;
  local_128.pointerRecords.d.d = (Data *)0x0;
  local_128.pointerRecords.d.ptr = (QDnsDomainNameRecord *)0x0;
  local_128.pointerRecords.d.size = 0;
  local_148.d = (Data *)(this->pointerRecords).d.d;
  local_148.ptr = (QDnsServiceRecord *)(this->pointerRecords).d.ptr;
  (this->pointerRecords).d.d = pDVar6;
  (this->pointerRecords).d.ptr = pQVar7;
  local_148.size = (this->pointerRecords).d.size;
  (this->pointerRecords).d.size = qVar5;
  QArrayDataPointer<QDnsDomainNameRecord>::~QArrayDataPointer
            ((QArrayDataPointer<QDnsDomainNameRecord> *)&local_148);
  qVar5 = local_128.serviceRecords.d.size;
  pQVar14 = local_128.serviceRecords.d.ptr;
  pDVar13 = local_128.serviceRecords.d.d;
  local_128.serviceRecords.d.d = (Data *)0x0;
  local_128.serviceRecords.d.ptr = (QDnsServiceRecord *)0x0;
  local_128.serviceRecords.d.size = 0;
  local_148.d = (this->serviceRecords).d.d;
  local_148.ptr = (this->serviceRecords).d.ptr;
  (this->serviceRecords).d.d = pDVar13;
  (this->serviceRecords).d.ptr = pQVar14;
  local_148.size = (this->serviceRecords).d.size;
  (this->serviceRecords).d.size = qVar5;
  QArrayDataPointer<QDnsServiceRecord>::~QArrayDataPointer(&local_148);
  qVar5 = local_128.tlsAssociationRecords.d.size;
  pQVar16 = local_128.tlsAssociationRecords.d.ptr;
  pDVar15 = local_128.tlsAssociationRecords.d.d;
  local_128.tlsAssociationRecords.d.d = (Data *)0x0;
  local_128.tlsAssociationRecords.d.ptr = (QDnsTlsAssociationRecord *)0x0;
  local_128.tlsAssociationRecords.d.size = 0;
  local_148.d = (Data *)(this->tlsAssociationRecords).d.d;
  local_148.ptr = (QDnsServiceRecord *)(this->tlsAssociationRecords).d.ptr;
  (this->tlsAssociationRecords).d.d = pDVar15;
  (this->tlsAssociationRecords).d.ptr = pQVar16;
  local_148.size = (this->tlsAssociationRecords).d.size;
  (this->tlsAssociationRecords).d.size = qVar5;
  QArrayDataPointer<QDnsTlsAssociationRecord>::~QArrayDataPointer
            ((QArrayDataPointer<QDnsTlsAssociationRecord> *)&local_148);
  qVar5 = local_128.textRecords.d.size;
  pQVar18 = local_128.textRecords.d.ptr;
  pDVar17 = local_128.textRecords.d.d;
  local_128.textRecords.d.d = (Data *)0x0;
  local_128.textRecords.d.ptr = (QDnsTextRecord *)0x0;
  local_128.textRecords.d.size = 0;
  local_148.d = (Data *)(this->textRecords).d.d;
  local_148.ptr = (QDnsServiceRecord *)(this->textRecords).d.ptr;
  (this->textRecords).d.d = pDVar17;
  (this->textRecords).d.ptr = pQVar18;
  local_148.size = (this->textRecords).d.size;
  (this->textRecords).d.size = qVar5;
  QArrayDataPointer<QDnsTextRecord>::~QArrayDataPointer
            ((QArrayDataPointer<QDnsTextRecord> *)&local_148);
  std::_Optional_payload_base<QSslConfiguration>::_M_move_assign
            ((_Optional_payload_base<QSslConfiguration> *)&this->sslConfiguration,
             (_Optional_payload_base<QSslConfiguration> *)&local_128.sslConfiguration);
  ~QDnsLookupReply(&local_128);
  this->error = InvalidReplyError;
  pDVar3 = (this->errorString).d.d;
  (this->errorString).d.d = (msg->d).d;
  (msg->d).d = pDVar3;
  pcVar4 = (this->errorString).d.ptr;
  (this->errorString).d.ptr = (msg->d).ptr;
  (msg->d).ptr = pcVar4;
  qVar5 = (this->errorString).d.size;
  (this->errorString).d.size = (msg->d).size;
  (msg->d).size = qVar5;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void makeInvalidReplyError(QString &&msg = QString())
    {
        if (msg.isEmpty())
            msg = QDnsLookup::tr("Invalid reply received");
        else
            msg = QDnsLookup::tr("Invalid reply received (%1)").arg(std::move(msg));
        *this = QDnsLookupReply();  // empty our lists
        setError(QDnsLookup::InvalidReplyError, std::move(msg));
    }